

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void js_async_function_free(JSRuntime *rt,JSAsyncFunctionData *s)

{
  int *piVar1;
  int iVar2;
  list_head *plVar3;
  list_head *plVar4;
  JSValue JVar5;
  
  (s->header).ref_count = (s->header).ref_count + -1;
  if ((s->header).ref_count != 0) {
    return;
  }
  if (s->is_active != 0) {
    async_func_free(rt,&s->func_state);
    s->is_active = 0;
  }
  piVar1 = (int *)s->resolving_funcs[0].u.ptr;
  JVar5 = s->resolving_funcs[0];
  if ((0xfffffff4 < (uint)s->resolving_funcs[0].tag) &&
     (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(rt,JVar5);
  }
  piVar1 = (int *)s->resolving_funcs[1].u.ptr;
  JVar5 = s->resolving_funcs[1];
  if ((0xfffffff4 < (uint)s->resolving_funcs[1].tag) &&
     (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(rt,JVar5);
  }
  plVar3 = (s->header).link.prev;
  plVar4 = (s->header).link.next;
  plVar3->next = plVar4;
  plVar4->prev = plVar3;
  (s->header).link.prev = (list_head *)0x0;
  (s->header).link.next = (list_head *)0x0;
  (*(rt->mf).js_free)(&rt->malloc_state,s);
  return;
}

Assistant:

static void js_async_function_free(JSRuntime *rt, JSAsyncFunctionData *s)
{
    if (--s->header.ref_count == 0) {
        js_async_function_free0(rt, s);
    }
}